

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::CropParameter::ByteSizeLong(CropParameter *this)

{
  bool bVar1;
  int iVar2;
  int32 value;
  UnknownFieldSet *unknown_fields;
  size_t sVar3;
  size_t sVar4;
  int cached_size;
  size_t data_size;
  size_t total_size;
  CropParameter *this_local;
  
  data_size = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = CropParameter::unknown_fields(this);
    data_size = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  sVar3 = google::protobuf::internal::WireFormatLite::UInt32Size(&this->offset_);
  iVar2 = offset_size(this);
  sVar4 = google::protobuf::internal::FromIntSize(iVar2);
  data_size = sVar3 + sVar4 + data_size;
  bVar1 = has_axis(this);
  if (bVar1) {
    value = axis(this);
    sVar3 = google::protobuf::internal::WireFormatLite::Int32Size(value);
    data_size = sVar3 + 1 + data_size;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar2;
  return data_size;
}

Assistant:

size_t CropParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.CropParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated uint32 offset = 2;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt32Size(this->offset_);
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->offset_size());
    total_size += data_size;
  }

  // optional int32 axis = 1 [default = 2];
  if (has_axis()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->axis());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}